

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  pointer pbVar1;
  char *pcVar2;
  ostream *poVar3;
  string *link_command_1;
  pointer pbVar4;
  cmOutputConverter *this_00;
  string_view source;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string linkScriptName;
  string link_command;
  cmGeneratedFileStream linkScriptStream;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  size_type local_2b8;
  pointer local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined1 local_298 [16];
  undefined8 local_288;
  size_type *local_280;
  size_t local_278;
  char *local_270;
  
  local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_2c8._M_str = (char *)&local_2b8;
  local_2c8._M_len = 1;
  local_2b8 = CONCAT71(local_2b8._1_7_,0x2f);
  local_288 = 1;
  local_280 = (size_type *)local_2c8._M_str;
  local_278 = strlen(name);
  views._M_len = 3;
  views._M_array = (iterator)local_298;
  local_270 = name;
  cmCatViews_abi_cxx11_(&local_308,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_308,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  pbVar4 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      if ((pbVar4->_M_string_length != 0) && (pcVar2 = (pbVar4->_M_dataplus)._M_p, *pcVar2 != ':'))
      {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,pcVar2,pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  this_00 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
             super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_348,this_00,&local_308);
  source._M_str = local_348._M_dataplus._M_p;
  source._M_len = local_348._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_328,this_00,source,SHELL);
  local_2c8._M_len = 0x26;
  local_2c8._M_str = "$(CMAKE_COMMAND) -E cmake_link_script ";
  local_2b8 = local_328._M_string_length;
  local_2b0 = local_328._M_dataplus._M_p;
  local_2a8 = 0x15;
  local_2a0 = " --verbose=$(VERBOSE)";
  views_00._M_len = 3;
  views_00._M_array = &local_2c8;
  cmCatViews_abi_cxx11_(&local_2e8,views_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_commands,
             &local_2e8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream linkScriptStream(linkScriptName);
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::string const& link_command : link_commands) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!link_command.empty() && link_command[0] != ':') {
      linkScriptStream << link_command << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command =
    cmStrCat("$(CMAKE_COMMAND) -E cmake_link_script ",
             this->LocalGenerator->ConvertToOutputFormat(
               this->LocalGenerator->MaybeRelativeToCurBinDir(linkScriptName),
               cmOutputConverter::SHELL),
             " --verbose=$(VERBOSE)");
  makefile_commands.push_back(std::move(link_command));
  makefile_depends.push_back(std::move(linkScriptName));
}